

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

duration profile<std::chrono::_V2::system_clock,main::__0>
                   (anon_class_32_4_12debb30 *f,size_t iter_count)

{
  rep rVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference pvVar3;
  value_type local_68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  time_point end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  time_point start;
  size_t i;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  durations;
  size_t iter_count_local;
  anon_class_32_4_12debb30 *f_local;
  
  durations.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iter_count;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
            *)&i);
  for (start.__d.__r = (duration)0;
      (ulong)start.__d.__r <
      durations.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      start.__d.__r = (duration)((long)start.__d.__r + 1)) {
    local_48.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    main::anon_class_32_4_12debb30::operator()(f);
    local_60.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_68.__r = (rep)std::chrono::operator-(&local_60,&local_48);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ::push_back((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                 *)&i,&local_68);
  }
  __first = std::
            vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
            ::begin((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                     *)&i);
  __last = std::
           vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
           ::end((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                  *)&i);
  std::
  sort<__gnu_cxx::__normal_iterator<std::chrono::duration<long,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
            ((__normal_iterator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
              )__last._M_current);
  sVar2 = std::
          vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ::size((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                  *)&i);
  pvVar3 = std::
           vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
           ::operator[]((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                         *)&i,sVar2 >> 1);
  rVar1 = pvVar3->__r;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
             *)&i);
  return (duration)rVar1;
}

Assistant:

auto profile(F&& f, size_t iter_count = 1) -> typename Clock::duration {
    std::vector<typename Clock::duration> durations;
    for (size_t i = 0; i < iter_count; ++i) {
        auto start = Clock::now();
        f();
        auto end = Clock::now();
        durations.push_back(end - start);
    }
    std::sort(durations.begin(), durations.end());
    return durations[durations.size() / 2];
}